

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

void __thiscall OpenMD::HydroProp::complete(HydroProp *this)

{
  long in_RDI;
  SquareMatrix<double,_6> *in_stack_00000098;
  SquareMatrix<double,_6> *in_stack_000000a0;
  
  if ((*(byte *)(in_RDI + 0x279) & 1) == 0) {
    snprintf(painCave.errMsg,2000,"HydroProp was asked to complete without a Resistance Tensor.\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  else {
    CholeskyDecomposition<OpenMD::SquareMatrix<double,6>>(in_stack_000000a0,in_stack_00000098);
    *(undefined1 *)(in_RDI + 0x27a) = 1;
  }
  return;
}

Assistant:

void HydroProp::complete() {
    if (hasXi_) {
      CholeskyDecomposition(Xi_, S_);
      hasS_ = true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "HydroProp was asked to complete without a Resistance Tensor.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }